

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

ArrayFeatureExtractor * __thiscall
CoreML::Specification::Model::mutable_arrayfeatureextractor(Model *this)

{
  bool bVar1;
  ArrayFeatureExtractor *this_00;
  Model *this_local;
  
  bVar1 = has_arrayfeatureextractor(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_arrayfeatureextractor(this);
    this_00 = (ArrayFeatureExtractor *)operator_new(0x28);
    ArrayFeatureExtractor::ArrayFeatureExtractor(this_00);
    (this->Type_).arrayfeatureextractor_ = this_00;
  }
  return (ArrayFeatureExtractor *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::ArrayFeatureExtractor* Model::mutable_arrayfeatureextractor() {
  if (!has_arrayfeatureextractor()) {
    clear_Type();
    set_has_arrayfeatureextractor();
    Type_.arrayfeatureextractor_ = new ::CoreML::Specification::ArrayFeatureExtractor;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.arrayFeatureExtractor)
  return Type_.arrayfeatureextractor_;
}